

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O0

void __thiscall Spc_Dsp::load(Spc_Dsp *this,uint8_t *regs)

{
  void *in_RSI;
  void *in_RDI;
  voice_t *v;
  int i;
  Spc_Dsp *in_stack_ffffffffffffffe0;
  int local_14;
  
  memcpy(in_RDI,in_RSI,0x80);
  memset((void *)((long)in_RDI + 0x80),0,0x638);
  local_14 = 8;
  while (local_14 = local_14 + -1, -1 < local_14) {
    in_stack_ffffffffffffffe0 = (Spc_Dsp *)((long)in_RDI + (long)local_14 * 0x90 + 0x138);
    (in_stack_ffffffffffffffe0->m).regs[0x70] = '\x01';
    (in_stack_ffffffffffffffe0->m).regs[0x71] = '\0';
    (in_stack_ffffffffffffffe0->m).regs[0x72] = '\0';
    (in_stack_ffffffffffffffe0->m).regs[0x73] = '\0';
    *(Spc_Dsp **)((in_stack_ffffffffffffffe0->m).regs + 0x60) = in_stack_ffffffffffffffe0;
  }
  *(uint *)((long)in_RDI + 0x130) = (uint)*(byte *)((long)in_RDI + 0x4c);
  mute_voices(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
  soft_reset_common((Spc_Dsp *)0x83a051);
  return;
}

Assistant:

void Spc_Dsp::load( uint8_t const regs [register_count] )
{
	memcpy( m.regs, regs, sizeof m.regs );
	memset( &m.regs [register_count], 0, offsetof (state_t,ram) - register_count );
	
	// Internal state
	int i;
	for ( i = voice_count; --i >= 0; )
	{
		voice_t& v = m.voices [i];
		v.brr_offset = 1;
		v.buf_pos    = v.buf;
	}
	m.new_kon = REG(kon);
	
	mute_voices( m.mute_mask );
	soft_reset_common();
}